

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

int er_hint_cmp_fn(State *a,State *b,hash_fns_t *fns)

{
  int iVar1;
  Term *tb;
  Term *ta;
  VecHint *sb;
  VecHint *sa;
  uint i;
  hash_fns_t *fns_local;
  State *b_local;
  State *a_local;
  
  if ((a->error_recovery_hints).n == (b->error_recovery_hints).n) {
    for (sa._4_4_ = 0; sa._4_4_ < (a->error_recovery_hints).n; sa._4_4_ = sa._4_4_ + 1) {
      if ((((a->error_recovery_hints).v[sa._4_4_]->depth !=
            (b->error_recovery_hints).v[sa._4_4_]->depth) ||
          (iVar1 = strcmp(((((a->error_recovery_hints).v[sa._4_4_]->rule->elems).v
                            [((a->error_recovery_hints).v[sa._4_4_]->rule->elems).n - 1]->e).term)->
                          string,((((b->error_recovery_hints).v[sa._4_4_]->rule->elems).v
                                   [((b->error_recovery_hints).v[sa._4_4_]->rule->elems).n - 1]->e).
                                 term)->string), iVar1 != 0)) ||
         ((a->error_recovery_hints).v[sa._4_4_]->rule->prod->index !=
          (b->error_recovery_hints).v[sa._4_4_]->rule->prod->index)) {
        return 1;
      }
    }
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int er_hint_cmp_fn(State *a, State *b, hash_fns_t *fns) {
  uint i;
  VecHint *sa = &a->error_recovery_hints, *sb = &b->error_recovery_hints;
  Term *ta, *tb;
  (void)fns;
  if (sa->n != sb->n) return 1;
  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    tb = sb->v[i]->rule->elems.v[sb->v[i]->rule->elems.n - 1]->e.term;
    if (sa->v[i]->depth != sb->v[i]->depth || strcmp(ta->string, tb->string) ||
        sa->v[i]->rule->prod->index != sb->v[i]->rule->prod->index)
      return 1;
  }
  return 0;
}